

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeoffsets.cpp
# Opt level: O2

seconds __thiscall TimeOffsets::Median(TimeOffsets *this)

{
  long lVar1;
  _Deque_iterator<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_&,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_*>
  __first;
  _Deque_iterator<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_&,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_*>
  __last;
  size_type sVar2;
  reference pdVar3;
  rep rVar4;
  long in_FS_OFFSET;
  deque<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  sorted_copy;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  rVar4 = 0;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock1,&this->m_mutex,"m_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/timeoffsets.cpp"
             ,0x24,false);
  sVar2 = std::
          deque<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
          ::size(&this->m_offsets);
  if (4 < sVar2) {
    std::
    deque<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::deque(&sorted_copy,&this->m_offsets);
    __first._M_first =
         sorted_copy.
         super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_first;
    __first._M_cur =
         sorted_copy.
         super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    __first._M_last =
         sorted_copy.
         super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_last;
    __first._M_node =
         sorted_copy.
         super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_node;
    __last._M_first =
         sorted_copy.
         super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_first;
    __last._M_cur =
         sorted_copy.
         super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_cur;
    __last._M_last =
         sorted_copy.
         super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_last;
    __last._M_node =
         sorted_copy.
         super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_node;
    std::
    sort<std::_Deque_iterator<std::chrono::duration<long,std::ratio<1l,1l>>,std::chrono::duration<long,std::ratio<1l,1l>>&,std::chrono::duration<long,std::ratio<1l,1l>>*>>
              (__first,__last);
    sVar2 = std::
            deque<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
            ::size((deque<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                    *)&sorted_copy.
                       super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                  );
    pdVar3 = std::
             _Deque_iterator<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_&,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_*>
             ::operator[](&sorted_copy.
                           super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                           ._M_impl.super__Deque_impl_data._M_start,sVar2 >> 1);
    rVar4 = pdVar3->__r;
    std::
    _Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::~_Deque_base(&sorted_copy.
                    super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                  );
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock1.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (seconds)rVar4;
  }
  __stack_chk_fail();
}

Assistant:

std::chrono::seconds TimeOffsets::Median() const
{
    LOCK(m_mutex);

    // Only calculate the median if we have 5 or more offsets
    if (m_offsets.size() < 5) return 0s;

    auto sorted_copy = m_offsets;
    std::sort(sorted_copy.begin(), sorted_copy.end());
    return sorted_copy[sorted_copy.size() / 2];  // approximate median is good enough, keep it simple
}